

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

ssize_t gnu_sparse_10_read(archive_read *a,tar *tar,size_t *unconsumed)

{
  wchar_t wVar1;
  int64_t iVar2;
  int64_t remaining_00;
  ulong uVar3;
  sparse_block *__ptr;
  int iVar4;
  ulong request;
  long lVar5;
  int64_t remaining;
  int64_t local_38;
  
  __ptr = tar->sparse_list;
  while (__ptr != (sparse_block *)0x0) {
    tar->sparse_list = __ptr->next;
    free(__ptr);
    __ptr = tar->sparse_list;
  }
  tar->sparse_last = (sparse_block *)0x0;
  local_38 = tar->entry_bytes_remaining;
  iVar2 = gnu_sparse_10_atol(a,tar,&local_38,unconsumed);
  if (-1 < (int)iVar2) {
    iVar4 = (int)iVar2 + 1;
    do {
      iVar4 = iVar4 + -1;
      if (iVar4 < 1) {
        if (*unconsumed != 0) {
          __archive_read_consume(a,*unconsumed);
          *unconsumed = 0;
        }
        lVar5 = tar->entry_bytes_remaining - local_38;
        request = (ulong)(-(int)lVar5 & 0x1ff);
        uVar3 = __archive_read_consume(a,request);
        if (request == uVar3) {
          return lVar5 + request;
        }
        return -0x1e;
      }
      iVar2 = gnu_sparse_10_atol(a,tar,&local_38,unconsumed);
    } while (((-1 < iVar2) &&
             (remaining_00 = gnu_sparse_10_atol(a,tar,&local_38,unconsumed), -1 < remaining_00)) &&
            (wVar1 = gnu_add_sparse_entry(a,tar,iVar2,remaining_00), wVar1 == L'\0'));
  }
  return -0x1e;
}

Assistant:

static ssize_t
gnu_sparse_10_read(struct archive_read *a, struct tar *tar, size_t *unconsumed)
{
	ssize_t bytes_read;
	int entries;
	int64_t offset, size, to_skip, remaining;

	/* Clear out the existing sparse list. */
	gnu_clear_sparse_list(tar);

	remaining = tar->entry_bytes_remaining;

	/* Parse entries. */
	entries = (int)gnu_sparse_10_atol(a, tar, &remaining, unconsumed);
	if (entries < 0)
		return (ARCHIVE_FATAL);
	/* Parse the individual entries. */
	while (entries-- > 0) {
		/* Parse offset/size */
		offset = gnu_sparse_10_atol(a, tar, &remaining, unconsumed);
		if (offset < 0)
			return (ARCHIVE_FATAL);
		size = gnu_sparse_10_atol(a, tar, &remaining, unconsumed);
		if (size < 0)
			return (ARCHIVE_FATAL);
		/* Add a new sparse entry. */
		if (gnu_add_sparse_entry(a, tar, offset, size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}
	/* Skip rest of block... */
	tar_flush_unconsumed(a, unconsumed);
	bytes_read = (ssize_t)(tar->entry_bytes_remaining - remaining);
	to_skip = 0x1ff & -bytes_read;
	if (to_skip != __archive_read_consume(a, to_skip))
		return (ARCHIVE_FATAL);
	return ((ssize_t)(bytes_read + to_skip));
}